

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execShiftIm<(moira::Core)0,(moira::Instr)97,(moira::Mode)11,4>(Moira *this,u16 opcode)

{
  u32 uVar1;
  uint cnt;
  
  cnt = 8;
  if ((opcode & 0xe00) != 0) {
    cnt = opcode >> 9 & 7;
  }
  prefetch<(moira::Core)0,4ull>(this);
  uVar1 = shift<(moira::Core)0,(moira::Instr)97,4>
                    (this,cnt,(ulong)*(uint *)((long)&(this->reg).field_3 + (ulong)(opcode & 7) * 4)
                    );
  *(u32 *)((long)&(this->reg).field_3 + (ulong)(opcode & 7) * 4) = uVar1;
  (*this->_vptr_Moira[2])(this,(ulong)(cnt * 2 + 8));
  return;
}

Assistant:

void
Moira::execShiftIm(u16 opcode)
{
    AVAILABILITY(Core::C68000)

    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);
    int cnt = src ? src : 8;
    int cyc = (S == Long ? 4 : 2) + 2 * cnt;

    prefetch<C, POLL>();
    SYNC(cyc);

    writeD<S>(dst, shift<C, I, S>(cnt, readD<S>(dst)));

    if constexpr (C == Core::C68000 || C == Core::C68010) {

        CYCLES(4 + cyc);

    } else {

        switch (I) {

            case Instr::LSL:
            case Instr::LSR:
                
                CYCLES(4);
                break;
                
            case Instr::ROL:
            case Instr::ROR:
            case Instr::ASL:
                
                CYCLES(8);
                break;
                
            case Instr::ROXL:
            case Instr::ROXR:
                
                CYCLES(12);
                break;
                
            default:
                
                CYCLES(6);
                break;
        }
    }

    FINALIZE
}